

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotHeatmap<double>
               (char *label_id,double *values,int rows,int cols,double scale_min,double scale_max,
               char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_58;
  TransformerLinLog local_54;
  TransformerLogLin local_50;
  TransformerLinLin local_4c;
  ImDrawList *local_48;
  ImDrawList *DrawList;
  ImPlotPoint *bounds_min_local;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  double *values_local;
  char *label_id_local;
  
  bVar1 = false;
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    bVar1 = true;
  }
  DrawList = (ImDrawList *)bounds_min;
  bounds_min_local = (ImPlotPoint *)fmt;
  fmt_local = (char *)scale_max;
  scale_max_local = scale_min;
  scale_min_local._0_4_ = cols;
  scale_min_local._4_4_ = rows;
  _cols_local = values;
  values_local = (double *)label_id;
  if (bVar1) {
    bVar1 = BeginItem(label_id,-1);
    if (bVar1) {
      bVar1 = FitThisFrame();
      if (bVar1) {
        FitPoint((ImPlotPoint *)DrawList);
        FitPoint(bounds_max);
      }
      local_48 = GetPlotDrawList();
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_4c);
        RenderHeatmap<double,ImPlot::TransformerLinLin>
                  (local_4c,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                   scale_max_local,(double)fmt_local,(char *)bounds_min_local,
                   (ImPlotPoint *)DrawList,bounds_max);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_50);
        RenderHeatmap<double,ImPlot::TransformerLogLin>
                  (local_50,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                   scale_max_local,(double)fmt_local,(char *)bounds_min_local,
                   (ImPlotPoint *)DrawList,bounds_max);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_54);
        RenderHeatmap<double,ImPlot::TransformerLinLog>
                  (local_54,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                   scale_max_local,(double)fmt_local,(char *)bounds_min_local,
                   (ImPlotPoint *)DrawList,bounds_max);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_58);
        RenderHeatmap<double,ImPlot::TransformerLogLog>
                  (local_58,local_48,_cols_local,scale_min_local._4_4_,scale_min_local._0_4_,
                   scale_max_local,(double)fmt_local,(char *)bounds_min_local,
                   (ImPlotPoint *)DrawList,bounds_max);
      }
      EndItem();
    }
    return;
  }
  __assert_fail("(scale_min != scale_max) && \"Scale values must be different!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/implot/implot_items.cpp"
                ,0x6a8,
                "void ImPlot::PlotHeatmap(const char *, const T *, int, int, double, double, const char *, const ImPlotPoint &, const ImPlotPoint &) [T = double]"
               );
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    IM_ASSERT_USER_ERROR(scale_min != scale_max, "Scale values must be different!");
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
        }
        EndItem();
    }
}